

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_insert(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  long lVar1;
  uint uVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  REF_DBL *pRVar7;
  REF_NODE pRVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  double dVar20;
  REF_INT new_node;
  REF_BOOL has_support;
  REF_INT tet;
  REF_GLOB global;
  REF_INT local_10c;
  REF_NODE local_108;
  long local_100;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  local_108 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  ref_node = ref_layer->ref_grid->node;
  uVar2 = ref_layer->nnode_per_layer;
  uVar18 = 0;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
  }
  local_100 = (long)(int)uVar2 * 0x78;
  do {
    if (uVar18 == uVar13) {
      uVar9 = ref_node_rebuild_sorted_global(ref_node);
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        pcVar19 = "rebuild";
        uVar16 = 0x146;
LAB_001e6e84:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar16,"ref_layer_insert",(ulong)uVar9,pcVar19);
      }
      return uVar9;
    }
    if (((long)uVar18 < (long)ref_node->max) && (global = ref_node->global[uVar18], -1 < global)) {
      tet = -1;
      if (global < ref_cell->ref_adj->nnode) {
        tet = ref_cell->ref_adj->first[global];
      }
    }
    else {
      global = -1;
      tet = -1;
    }
    lVar1 = uVar18 + (long)(int)uVar2;
    uVar9 = ref_grid_enclosing_tet(ref_grid,ref_node->real + lVar1 * 0xf,&tet,bary);
    if (uVar9 != 0) {
      pcVar19 = "enclosing tet";
      uVar16 = 0xe7;
LAB_001e6eb3:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar16,"ref_layer_insert",(ulong)uVar9,pcVar19);
      return uVar9;
    }
    uVar9 = ref_cell_nodes(ref_cell,tet,nodes);
    if (uVar9 != 0) {
      pcVar19 = "nodes";
      uVar16 = 0xe8;
      goto LAB_001e6eb3;
    }
    iVar17 = 0;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      dVar20 = bary[lVar10];
      if (dVar20 <= -dVar20) {
        dVar20 = -dVar20;
      }
      iVar17 = iVar17 + (uint)(dVar20 < 1e-10);
    }
    new_node = -1;
    if (iVar17 == 2) {
      uVar15 = 0;
      uVar11 = 0xffffffffffffffff;
      uVar14 = 0xffffffff;
      while( true ) {
        iVar12 = (int)uVar11;
        iVar17 = (int)uVar14;
        if (uVar15 == 4) break;
        dVar20 = bary[uVar15];
        if (dVar20 <= -dVar20) {
          dVar20 = -dVar20;
        }
        if (1e-10 <= dVar20) {
          if (iVar12 == -1) {
            uVar11 = uVar15 & 0xffffffff;
          }
          else {
            if (iVar17 != -1) {
              pcVar19 = "more non-zeros than nodes";
              uVar16 = 0xfb;
              goto LAB_001e69c2;
            }
            uVar14 = uVar15 & 0xffffffff;
          }
        }
        uVar15 = uVar15 + 1;
      }
      if (iVar12 == -1) {
        pcVar19 = "non-zero node0 missing";
        uVar16 = 0xfd;
        goto LAB_001e69c2;
      }
      if (iVar17 == -1) {
        pcVar19 = "non-zero node1 missing";
        uVar16 = 0xfe;
        goto LAB_001e69c2;
      }
      RVar3 = nodes[iVar12];
      RVar4 = nodes[iVar17];
      uVar9 = ref_geom_supported(ref_grid->geom,RVar4,&has_support);
      if (uVar9 != 0) {
        pcVar19 = "got geom?";
        uVar16 = 0x102;
        goto LAB_001e6e84;
      }
      if (has_support != 0) {
        pcVar19 = "add geometry handling";
        uVar9 = 6;
        uVar16 = 0x103;
        goto LAB_001e6e84;
      }
      uVar9 = ref_geom_supported(ref_grid->geom,RVar3,&has_support);
      pRVar8 = local_108;
      if (uVar9 != 0) {
        pcVar19 = "got geom?";
        uVar16 = 0x105;
        goto LAB_001e6e84;
      }
      if (has_support != 0) {
        pcVar19 = "add geometry handling";
        uVar9 = 6;
        uVar16 = 0x106;
        goto LAB_001e6e84;
      }
      uVar9 = ref_node_next_global(local_108,&global);
      if (uVar9 != 0) {
        pcVar19 = "next global";
        uVar16 = 0x107;
LAB_001e6db0:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar16,"ref_layer_insert",(ulong)uVar9,pcVar19);
        return uVar9;
      }
      uVar9 = ref_node_add(pRVar8,global,&new_node);
      if (uVar9 != 0) {
        pcVar19 = "new node";
        uVar16 = 0x108;
        goto LAB_001e6db0;
      }
      uVar9 = ref_node_interpolate_edge(pRVar8,RVar3,RVar4,0.5,new_node);
      if (uVar9 != 0) {
        pcVar19 = "interp new node";
        uVar16 = 0x10a;
        goto LAB_001e6db0;
      }
      uVar9 = ref_geom_add_between(ref_grid,RVar3,RVar4,0.5,new_node);
      if (uVar9 != 0) {
        pcVar19 = "geom new node";
        uVar16 = 0x10c;
        goto LAB_001e6db0;
      }
      uVar9 = ref_geom_constrain(ref_grid,new_node);
      if (uVar9 != 0) {
        pcVar19 = "geom constraint";
        uVar16 = 0x10d;
        goto LAB_001e6db0;
      }
      uVar9 = ref_split_edge(ref_grid,RVar3,RVar4,new_node);
      if (uVar9 != 0) {
        pcVar19 = "split";
        uVar16 = 0x10e;
        goto LAB_001e6eb3;
      }
      pRVar6 = local_108->real;
      pRVar7 = ref_node->real;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        pRVar6[new_node * 0xf + lVar10] = *(REF_DBL *)((long)pRVar7 + lVar10 * 8 + local_100);
      }
    }
    else {
      if (iVar17 != 1) {
        if (ref_layer->verbose != 0) {
          printf("implement zeros %d bary %f %f %f %f\n",bary[0],bary[1],bary[2],bary[3]);
        }
        pcVar19 = "missing a general case";
        uVar9 = 6;
        uVar16 = 0x13d;
        goto LAB_001e6e84;
      }
      uVar11 = 0xffffffffffffffff;
      for (uVar14 = 0; iVar17 = (int)uVar11, uVar14 != 4; uVar14 = uVar14 + 1) {
        dVar20 = bary[uVar14];
        if (dVar20 <= -dVar20) {
          dVar20 = -dVar20;
        }
        if (dVar20 < 1e-10) {
          if (iVar17 != -1) {
            pcVar19 = "more zeros than nodes";
            uVar16 = 0x11b;
            goto LAB_001e69c2;
          }
          uVar11 = uVar14 & 0xffffffff;
        }
      }
      if (iVar17 == -1) {
        pcVar19 = "non-zero node0 missing";
        uVar16 = 0x11d;
        goto LAB_001e69c2;
      }
      pRVar5 = ref_cell->f2n;
      local_10c = nodes[pRVar5[iVar17 * 4]];
      RVar3 = nodes[pRVar5[iVar17 * 4 + 1]];
      RVar4 = nodes[pRVar5[iVar17 * 4 + 2]];
      uVar9 = ref_geom_supported(ref_grid->geom,local_10c,&has_support);
      if (uVar9 != 0) {
        pcVar19 = "got geom?";
        uVar16 = 0x125;
        goto LAB_001e6e84;
      }
      if (has_support != 0) {
        pcVar19 = "add geometry handling";
        uVar9 = 6;
        uVar16 = 0x126;
        goto LAB_001e6e84;
      }
      uVar9 = ref_geom_supported(ref_grid->geom,RVar3,&has_support);
      if (uVar9 != 0) {
        pcVar19 = "got geom?";
        uVar16 = 0x128;
        goto LAB_001e6e84;
      }
      if (has_support != 0) {
        pcVar19 = "add geometry handling";
        uVar9 = 6;
        uVar16 = 0x129;
        goto LAB_001e6e84;
      }
      uVar9 = ref_geom_supported(ref_grid->geom,RVar4,&has_support);
      pRVar8 = local_108;
      if (uVar9 != 0) {
        pcVar19 = "got geom?";
        uVar16 = 299;
        goto LAB_001e6e84;
      }
      if (has_support != 0) {
        pcVar19 = "add geometry handling";
        uVar9 = 6;
        uVar16 = 300;
        goto LAB_001e6e84;
      }
      uVar9 = ref_node_next_global(local_108,&global);
      if (uVar9 != 0) {
        pcVar19 = "next global";
        uVar16 = 0x12d;
        goto LAB_001e6e84;
      }
      uVar9 = ref_node_add(pRVar8,global,&new_node);
      if (uVar9 != 0) {
        pcVar19 = "new node";
        uVar16 = 0x12e;
        goto LAB_001e6e84;
      }
      uVar9 = ref_node_interpolate_face(pRVar8,local_10c,RVar3,RVar4,new_node);
      if (uVar9 != 0) {
        pcVar19 = "interp new node";
        uVar16 = 0x130;
        goto LAB_001e6e84;
      }
      pRVar6 = pRVar8->real;
      pRVar7 = ref_node->real;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        pRVar6[new_node * 0xf + lVar10] = *(REF_DBL *)((long)pRVar7 + lVar10 * 8 + local_100);
      }
      uVar9 = ref_split_face(ref_grid,local_10c,RVar3,RVar4,new_node);
      if (uVar9 != 0) {
        pcVar19 = "fsplit";
        uVar16 = 0x134;
        goto LAB_001e6eb3;
      }
      if (ref_layer->verbose != 0) {
        printf("split zeros %d bary %f %f %f %f\n",bary[0],bary[1],bary[2],bary[3],1);
      }
    }
    if ((long)new_node == -1) {
      pcVar19 = "new_node not set";
      uVar16 = 0x140;
LAB_001e69c2:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar16,"ref_layer_insert",pcVar19);
      return 1;
    }
    ref_node->global[lVar1] = (long)new_node;
    if ((ref_layer->verbose != 0) && (uVar9 = ref_validation_cell_volume(ref_grid), uVar9 != 0)) {
      pcVar19 = "vol";
      uVar16 = 0x143;
      goto LAB_001e6eb3;
    }
    uVar18 = uVar18 + 1;
    local_100 = local_100 + 0x78;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_layer_insert(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_INT nnode_per_layer, node, local;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], node0, node1, node2, node3;
  REF_INT tet, i, new_node;
  REF_DBL bary[4];
  REF_INT zeros;
  REF_DBL zero_tol = 1.0e-10;
  REF_BOOL has_support;

  nnode_per_layer = ref_layer->nnode_per_layer;

  for (node = 0; node < nnode_per_layer; node++) {
    global = ref_node_global(layer_node, node); /* base */
    tet = ref_adj_first(ref_cell_adj(ref_cell), global);
    local = node + nnode_per_layer; /* target */
    RSS(ref_grid_enclosing_tet(ref_grid, ref_node_xyz_ptr(layer_node, local),
                               &tet, bary),
        "enclosing tet");
    RSS(ref_cell_nodes(ref_cell, tet, nodes), "nodes");
    zeros = 0;
    for (i = 0; i < 4; i++)
      if (ABS(bary[i]) < zero_tol) zeros++;
    new_node = REF_EMPTY;
    switch (zeros) {
      case 2: /* split an edge */
        node0 = REF_EMPTY;
        node1 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) >= zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            if (node1 == REF_EMPTY) {
              node1 = i;
              continue;
            }
            THROW("more non-zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        if (node1 == REF_EMPTY) THROW("non-zero node1 missing");
        node0 = nodes[node0];
        node1 = nodes[node1];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
            "interp new node");
        RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
            "geom new node");
        RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
        RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        break;
      case 1: /* split a triangular face*/
        node0 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) < zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            THROW("more zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        node1 = ref_cell_f2n_gen(ref_cell, 0, node0);
        node2 = ref_cell_f2n_gen(ref_cell, 1, node0);
        node3 = ref_cell_f2n_gen(ref_cell, 2, node0);
        node1 = nodes[node1];
        node2 = nodes[node2];
        node3 = nodes[node3];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node2, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node3, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_face(ref_node, node1, node2, node3, new_node),
            "interp new node");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        RSS(ref_split_face(ref_grid, node1, node2, node3, new_node), "fsplit");
        if (ref_layer->verbose)
          printf("split zeros %d bary %f %f %f %f\n", zeros, bary[0], bary[1],
                 bary[2], bary[3]);
        break;
      default:
        if (ref_layer->verbose)
          printf("implement zeros %d bary %f %f %f %f\n", zeros, bary[0],
                 bary[1], bary[2], bary[3]);
        RSS(REF_IMPLEMENT, "missing a general case");
        break;
    }
    RAS(REF_EMPTY != new_node, "new_node not set");
    layer_node->global[local] = new_node;

    if (ref_layer->verbose) RSS(ref_validation_cell_volume(ref_grid), "vol");
  }

  RSS(ref_node_rebuild_sorted_global(layer_node), "rebuild");

  return REF_SUCCESS;
}